

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ConstCastTestT<long>(void)

{
  int iVar1;
  undefined8 in_RAX;
  undefined8 local_8;
  
  local_8 = in_RAX;
  if (ConstCastTestT<long>()::b == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::b);
    if (iVar1 != 0) {
      ConstCastTestT<long>::b = true;
      __cxa_guard_release(&ConstCastTestT<long>()::b);
    }
  }
  if (ConstCastTestT<long>()::w == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::w);
    if (iVar1 != 0) {
      local_8 = 1;
      ConstCastTestT<long>::w = SafeInt::operator_cast_to_wchar_t((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<long>()::w);
    }
  }
  if (ConstCastTestT<long>()::c == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::c);
    if (iVar1 != 0) {
      local_8 = 1;
      ConstCastTestT<long>::c = SafeInt::operator_cast_to_char((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<long>()::c);
    }
  }
  if (ConstCastTestT<long>()::sc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::sc);
    if (iVar1 != 0) {
      local_8 = 1;
      ConstCastTestT<long>::sc = SafeInt::operator_cast_to_signed_char((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<long>()::sc);
    }
  }
  if (ConstCastTestT<long>()::uc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::uc);
    if (iVar1 != 0) {
      local_8 = 1;
      ConstCastTestT<long>::uc = SafeInt::operator_cast_to_unsigned_char((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<long>()::uc);
    }
  }
  if (ConstCastTestT<long>()::s == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::s);
    if (iVar1 != 0) {
      local_8 = 1;
      ConstCastTestT<long>::s = SafeInt::operator_cast_to_short((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<long>()::s);
    }
  }
  if (ConstCastTestT<long>()::us == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::us);
    if (iVar1 != 0) {
      local_8 = 1;
      ConstCastTestT<long>::us = SafeInt::operator_cast_to_unsigned_short((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<long>()::us);
    }
  }
  if (ConstCastTestT<long>()::i == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::i);
    if (iVar1 != 0) {
      local_8 = 1;
      ConstCastTestT<long>::i = SafeInt::operator_cast_to_int((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<long>()::i);
    }
  }
  if (ConstCastTestT<long>()::ui == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::ui);
    if (iVar1 != 0) {
      local_8 = 1;
      ConstCastTestT<long>::ui = SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<long>()::ui);
    }
  }
  if (ConstCastTestT<long>()::l == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::l);
    if (iVar1 != 0) {
      ConstCastTestT<long>::l = 1;
      __cxa_guard_release(&ConstCastTestT<long>()::l);
    }
  }
  if (ConstCastTestT<long>()::ul == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::ul);
    if (iVar1 != 0) {
      local_8 = 1;
      ConstCastTestT<long>::ul = SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<long>()::ul);
    }
  }
  if (ConstCastTestT<long>()::ll == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::ll);
    if (iVar1 != 0) {
      ConstCastTestT<long>::ll = 1;
      __cxa_guard_release(&ConstCastTestT<long>()::ll);
    }
  }
  if (ConstCastTestT<long>()::ull == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::ull);
    if (iVar1 != 0) {
      local_8 = 1;
      ConstCastTestT<long>::ull = SafeInt::operator_cast_to_unsigned_long_long((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<long>()::ull);
    }
  }
  if (ConstCastTestT<long>()::st == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::st);
    if (iVar1 != 0) {
      local_8 = 1;
      ConstCastTestT<long>::st = SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<long>()::st);
    }
  }
  if (ConstCastTestT<long>()::pt == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::pt);
    if (iVar1 != 0) {
      ConstCastTestT<long>::pt = 1;
      __cxa_guard_release(&ConstCastTestT<long>()::pt);
    }
  }
  if (ConstCastTestT<long>()::pl == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<long>()::pl);
    if (iVar1 != 0) {
      local_8 = 1;
      ConstCastTestT<long>::pl = SafeInt::operator_cast_to_int((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<long>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}